

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_Initialize(void)

{
  if (pm_initialized == 0) {
    pm_hosterror = 0;
    pm_hosterror_text[0] = '\0';
    pm_init();
    pm_initialized = 1;
  }
  return pmNoData;
}

Assistant:

PMEXPORT PmError Pm_Initialize( void ) {
    if (!pm_initialized) {
        pm_hosterror = FALSE;
        pm_hosterror_text[0] = 0; /* the null string */
        pm_init();
        pm_initialized = TRUE;
    }
    return pmNoError;
}